

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O3

Vec_Wec_t * Abc_NtkDetectObjClasses(Abc_Ntk_t *pNtk,Vec_Int_t *vObjs,Vec_Wec_t **pvCos)

{
  void *pvVar1;
  Abc_Obj_t *pObj;
  Vec_Int_t *pVVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Hsh_VecMan_t *p;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  Vec_Ptr_t *pVVar9;
  Vec_Wec_t *p_00;
  long lVar10;
  Vec_Wec_t *pVVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  void *local_50;
  
  p = (Hsh_VecMan_t *)calloc(1,0x48);
  uVar13 = 999;
  while( true ) {
    do {
      uVar5 = uVar13;
      uVar13 = uVar5 + 1;
    } while ((uVar5 & 1) != 0);
    if (uVar13 < 9) break;
    iVar12 = 5;
    while (uVar13 % (iVar12 - 2U) != 0) {
      uVar3 = iVar12 * iVar12;
      iVar12 = iVar12 + 2;
      if (uVar13 < uVar3) goto LAB_002a7113;
    }
  }
LAB_002a7113:
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  uVar3 = uVar13;
  if (uVar5 < 0xf) {
    uVar3 = 0x10;
  }
  pVVar6->nCap = uVar3;
  piVar7 = (int *)malloc((long)(int)uVar3 << 2);
  pVVar6->pArray = piVar7;
  pVVar6->nSize = uVar13;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0xff,(long)(int)uVar13 << 2);
  }
  p->vTable = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 4000;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(16000);
  pVVar6->pArray = piVar7;
  p->vData = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(4000);
  pVVar6->pArray = piVar7;
  p->vMap = pVVar6;
  iVar12 = pNtk->vObjs->nSize;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar12 - 1U) {
    iVar4 = iVar12;
  }
  pVVar6->nCap = iVar4;
  if (iVar4 == 0) {
    pVVar6->pArray = (int *)0x0;
    pVVar6->nSize = iVar12;
  }
  else {
    piVar7 = (int *)malloc((long)iVar4 << 2);
    pVVar6->pArray = piVar7;
    pVVar6->nSize = iVar12;
    if (piVar7 != (int *)0x0) {
      memset(piVar7,0xff,(long)iVar12 << 2);
    }
  }
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 0x10;
  pVVar8->nSize = 0;
  piVar7 = (int *)malloc(0x40);
  pVVar8->pArray = piVar7;
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                  ,0x193,
                  "Vec_Wec_t *Abc_NtkDetectObjClasses(Abc_Ntk_t *, Vec_Int_t *, Vec_Wec_t **)");
  }
  iVar12 = Hsh_VecManAdd(p,pVVar8);
  if (iVar12 != 0) {
    __assert_fail("SetId == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                  ,0x196,
                  "Vec_Wec_t *Abc_NtkDetectObjClasses(Abc_Ntk_t *, Vec_Int_t *, Vec_Wec_t **)");
  }
  pVVar9 = pNtk->vCos;
  if (0 < pVVar9->nSize) {
    lVar15 = 0;
    do {
      pvVar1 = pVVar9->pArray[lVar15];
      iVar12 = *(int *)((long)pvVar1 + 0x10);
      piVar7 = pVVar8->pArray;
      if (pVVar8->nCap < 1) {
        if (piVar7 == (int *)0x0) {
          piVar7 = (int *)malloc(4);
        }
        else {
          piVar7 = (int *)realloc(piVar7,4);
        }
        pVVar8->pArray = piVar7;
        if (piVar7 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar8->nCap = 1;
      }
      *piVar7 = iVar12;
      pVVar8->nSize = 1;
      iVar4 = Hsh_VecManAdd(p,pVVar8);
      iVar12 = *(int *)((long)pvVar1 + 0x10);
      if (((long)iVar12 < 0) || (pVVar6->nSize <= iVar12)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar6->pArray[iVar12] = iVar4;
      lVar15 = lVar15 + 1;
      pVVar9 = pNtk->vCos;
    } while (lVar15 < pVVar9->nSize);
  }
  qsort(vObjs->pArray,(long)vObjs->nSize,4,Vec_IntSortCompare1);
  iVar12 = vObjs->nSize;
  if (0 < iVar12) {
    lVar15 = 0;
    do {
      iVar4 = vObjs->pArray[lVar15];
      if (((long)iVar4 < 0) || (pNtk->vObjs->nSize <= iVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pObj = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar4];
      if (pObj != (Abc_Obj_t *)0x0) {
        Abc_NtkDetectObjClasses_rec(pObj,pVVar6,p,pVVar8);
        iVar12 = vObjs->nSize;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar12);
  }
  if (pVVar8->pArray != (int *)0x0) {
    free(pVVar8->pArray);
  }
  free(pVVar8);
  iVar12 = p->vMap->nSize;
  lVar15 = (long)iVar12 + 1;
  iVar4 = 0x10;
  if (0xe < (ulong)(long)iVar12) {
    iVar4 = (int)lVar15;
  }
  uVar13 = 0;
  if (iVar4 != 0) {
    local_50 = malloc((long)iVar4 << 2);
    if (local_50 != (void *)0x0) {
      memset(local_50,0xff,lVar15 * 4);
      goto LAB_002a73ec;
    }
  }
  local_50 = (void *)0x0;
LAB_002a73ec:
  p_00 = (Vec_Wec_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  pVVar8 = (Vec_Int_t *)calloc(1000,0x10);
  p_00->pArray = pVVar8;
  if (0 < vObjs->nSize) {
    lVar15 = 0;
    do {
      iVar4 = vObjs->pArray[lVar15];
      if (((long)iVar4 < 0) || (pVVar6->nSize <= iVar4)) goto LAB_002a7677;
      lVar10 = (long)pVVar6->pArray[iVar4];
      if (lVar10 < 0) {
        __assert_fail("SetId >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                      ,0x1ac,
                      "Vec_Wec_t *Abc_NtkDetectObjClasses(Abc_Ntk_t *, Vec_Int_t *, Vec_Wec_t **)");
      }
      if (iVar12 < pVVar6->pArray[iVar4]) goto LAB_002a7677;
      uVar13 = *(uint *)((long)local_50 + lVar10 * 4);
      if ((ulong)uVar13 == 0xffffffff) {
        *(int *)((long)local_50 + lVar10 * 4) = p_00->nSize;
        pVVar8 = Vec_WecPushLevel(p_00);
      }
      else {
        if (((int)uVar13 < 0) || (p_00->nSize <= (int)uVar13)) goto LAB_002a7696;
        pVVar8 = p_00->pArray + uVar13;
      }
      Vec_IntPush(pVVar8,iVar4);
      lVar15 = lVar15 + 1;
    } while (lVar15 < vObjs->nSize);
    uVar13 = p_00->nSize;
  }
  pVVar11 = (Vec_Wec_t *)malloc(0x10);
  uVar5 = 8;
  if (6 < uVar13 - 1) {
    uVar5 = uVar13;
  }
  pVVar11->nCap = uVar5;
  if (uVar5 == 0) {
    pVVar8 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar8 = (Vec_Int_t *)calloc((long)(int)uVar5,0x10);
  }
  pVVar11->pArray = pVVar8;
  pVVar11->nSize = uVar13;
  *pvCos = pVVar11;
  if (0 < (int)uVar13) {
    pVVar8 = p_00->pArray;
    uVar14 = 0;
    do {
      if (pVVar8[uVar14].nSize < 1) {
LAB_002a7677:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar12 = *pVVar8[uVar14].pArray;
      if (((long)iVar12 < 0) || (pVVar6->nSize <= iVar12)) goto LAB_002a7677;
      iVar12 = pVVar6->pArray[iVar12];
      if ((long)iVar12 < 0) {
        __assert_fail("SetId >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                      ,0x1c4,
                      "Vec_Wec_t *Abc_NtkDetectObjClasses(Abc_Ntk_t *, Vec_Int_t *, Vec_Wec_t **)");
      }
      if (p->vMap->nSize <= iVar12) goto LAB_002a7677;
      iVar12 = p->vMap->pArray[iVar12];
      if (((long)iVar12 < 0) || (p->vData->nSize <= iVar12)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar7 = p->vData->pArray + iVar12;
      iVar12 = *piVar7;
      (p->vTemp).nCap = iVar12;
      (p->vTemp).nSize = iVar12;
      (p->vTemp).pArray = piVar7 + 2;
      if ((long)(*pvCos)->nSize <= (long)uVar14) {
LAB_002a7696:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      if (0 < iVar12) {
        pVVar2 = (*pvCos)->pArray;
        lVar15 = 0;
        do {
          Vec_IntPush(pVVar2 + uVar14,(p->vTemp).pArray[lVar15]);
          lVar15 = lVar15 + 1;
        } while (lVar15 < (p->vTemp).nSize);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar13);
  }
  pVVar8 = p->vTable;
  piVar7 = pVVar8->pArray;
  if (piVar7 != (int *)0x0) {
    free(piVar7);
  }
  free(pVVar8);
  pVVar8 = p->vData;
  piVar7 = pVVar8->pArray;
  if (piVar7 != (int *)0x0) {
    free(piVar7);
  }
  free(pVVar8);
  pVVar8 = p->vMap;
  piVar7 = pVVar8->pArray;
  if (piVar7 != (int *)0x0) {
    free(piVar7);
  }
  free(pVVar8);
  free(p);
  if (local_50 != (void *)0x0) {
    free(local_50);
  }
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
  }
  free(pVVar6);
  return p_00;
}

Assistant:

Vec_Wec_t * Abc_NtkDetectObjClasses( Abc_Ntk_t * pNtk, Vec_Int_t * vObjs, Vec_Wec_t ** pvCos )
{
    Vec_Wec_t * vClasses;   // classes of equivalence objects from vObjs
    Vec_Int_t * vClassMap;  // mapping of each CO set into its class in vClasses
    Vec_Int_t * vClass;     // one equivalence class     
    Abc_Obj_t * pObj; 
    int i, iObj, SetId, ClassId;
    // create hash table to hash sets of CO indexes
    Hsh_VecMan_t * pHash = Hsh_VecManStart( 1000 );
    // create elementary sets (each composed of one CO) and map COs into them
    Vec_Int_t * vMap = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
    Vec_Int_t * vSet = Vec_IntAlloc( 16 );
    assert( Abc_NtkIsLogic(pNtk) );
    // compute empty set
    SetId = Hsh_VecManAdd( pHash, vSet );
    assert( SetId == 0 );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Vec_IntFill( vSet, 1, Abc_ObjId(pObj) );
        SetId = Hsh_VecManAdd( pHash, vSet );
        Vec_IntWriteEntry( vMap, Abc_ObjId(pObj), SetId );
    }
    // make sure the array of objects is sorted
    Vec_IntSort( vObjs, 0 );
    // begin from the objects and map their IDs into sets of COs
    Abc_NtkForEachObjVec( vObjs, pNtk, pObj, i )
        Abc_NtkDetectObjClasses_rec( pObj, vMap, pHash, vSet );
    Vec_IntFree( vSet );
    // create map for mapping CO set its their classes
    vClassMap = Vec_IntStartFull( Hsh_VecSize(pHash) + 1 );
    // collect classes of objects
    vClasses = Vec_WecAlloc( 1000 );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        //char * pName = Abc_ObjName( Abc_NtkObj(pNtk, iObj) );
        // for a given object (iObj), find the ID of its COs set
        SetId = Vec_IntEntry( vMap, iObj );
        assert( SetId >= 0 );
        // for the given CO set, finds its equivalence class
        ClassId = Vec_IntEntry( vClassMap, SetId );
        if ( ClassId == -1 )  // there is no equivalence class
        {
            // map this CO set into a new equivalence class
            Vec_IntWriteEntry( vClassMap, SetId, Vec_WecSize(vClasses) );
            vClass = Vec_WecPushLevel( vClasses );
        }
        else // get hold of the equivalence class
            vClass = Vec_WecEntry( vClasses, ClassId );
        // add objects to the class
        Vec_IntPush( vClass, iObj );
        // print the set for this object
        //printf( "Object %5d : ", iObj );
        //Vec_IntPrint( Hsh_VecReadEntry(pHash, SetId) );
    }
    // collect arrays of COs for each class
    *pvCos = Vec_WecStart( Vec_WecSize(vClasses) );
    Vec_WecForEachLevel( vClasses, vClass, i )
    {
        iObj = Vec_IntEntry( vClass, 0 );
        // for a given object (iObj), find the ID of its COs set
        SetId = Vec_IntEntry( vMap, iObj );
        assert( SetId >= 0 );
        // for the given CO set ID, find the set
        vSet = Hsh_VecReadEntry( pHash, SetId );
        Vec_IntAppend( Vec_WecEntry(*pvCos, i), vSet );
    }
    Hsh_VecManStop( pHash );
    Vec_IntFree( vClassMap );
    Vec_IntFree( vMap );
    return vClasses;
}